

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scheduler.c
# Opt level: O2

void detach_for_steal(__cilkrts_worker *w,__cilkrts_worker *victim,cilk_fiber *fiber)

{
  local_state *plVar1;
  local_state *plVar2;
  __cilkrts_stack_frame **pp_Var3;
  full_frame *ff;
  __cilkrts_stack_frame *p_Var4;
  __cilkrts_stack_frame *p_Var5;
  __cilkrts_stack_frame *p_Var6;
  full_frame *pfVar7;
  char *pcVar8;
  undefined8 uVar9;
  __cilkrts_stack_frame *sf;
  full_frame *_locked_ff;
  
  plVar1 = victim->l;
  plVar2 = w->l;
  plVar2->team = plVar1->team;
  if ((w == victim) || (plVar2->frame_ff == (full_frame *)0x0)) {
    pp_Var3 = victim->head;
    if (*pp_Var3 == (__cilkrts_stack_frame *)0x0) {
      pcVar8 = "*h";
      uVar9 = 0x2ec;
    }
    else {
      victim->head = pp_Var3 + 1;
      ff = plVar1->frame_ff;
      __cilkrts_frame_lock(w,ff);
      decjoin(ff);
      p_Var4 = *pp_Var3;
      if (p_Var4 == (__cilkrts_stack_frame *)0x0) {
        pcVar8 = "sf";
        uVar9 = 0x2b6;
      }
      else {
        if (p_Var4->worker != w) {
          *(byte *)&p_Var4->flags = (byte)p_Var4->flags | 2;
        }
        p_Var6 = (__cilkrts_stack_frame *)0x0;
        p_Var5 = p_Var4;
        do {
          sf = p_Var5;
          if ((sf->flags & 0x85) != 0) {
            sf->call_parent = p_Var6;
            break;
          }
          p_Var5 = sf->call_parent;
          sf->call_parent = p_Var6;
          p_Var6 = sf;
        } while (p_Var5 != (__cilkrts_stack_frame *)0x0);
        make_unrunnable(w,ff,sf,(uint)(sf == p_Var4),"steal 1");
        pfVar7 = ff;
        while( true ) {
          p_Var5 = sf->call_parent;
          sf->call_parent = (__cilkrts_stack_frame *)0x0;
          if (p_Var5 == (__cilkrts_stack_frame *)0x0) break;
          pfVar7 = make_child(w,pfVar7,p_Var5,(cilk_fiber *)0x0);
          make_unrunnable(w,pfVar7,p_Var5,(uint)(p_Var5 == p_Var4),"steal 2");
          sf = p_Var5;
        }
        if (sf->call_parent == (__cilkrts_stack_frame *)0x0) {
          plVar1 = victim->l;
          if ((plVar1->type == WORKER_USER) && (plVar1->last_full_frame == (full_frame *)0x0)) {
            plVar1->last_full_frame = pfVar7;
            pfVar7->sync_master = victim;
          }
          if (w == victim) {
            pfVar7->call_stack->flags = pfVar7->call_stack->flags | 2;
            pfVar7->simulated_stolen = 1;
          }
          else {
            __cilkrts_push_next_frame(w,pfVar7);
          }
          pfVar7 = make_child(w,pfVar7,(__cilkrts_stack_frame *)0x0,fiber);
          __cilkrts_frame_lock(w,pfVar7);
          pfVar7->join_counter = pfVar7->join_counter + 1;
          victim->l->frame_ff = pfVar7;
          pfVar7->call_stack = (__cilkrts_stack_frame *)0x0;
          __cilkrts_frame_unlock(w,pfVar7);
          __cilkrts_frame_unlock(w,ff);
          return;
        }
        pcVar8 = "!sf->call_parent";
        uVar9 = 0x2d6;
      }
    }
  }
  else {
    pcVar8 = "w->l->frame_ff == 0 || w == victim";
    uVar9 = 0x2e8;
  }
  __cilkrts_bug("%s:%d: cilk assertion failed: %s\n",
                "/workspace/llm4binary/github/license_all_cmakelists_25/passlab[P]intel-cilk-runtime/runtime/scheduler.c"
                ,uVar9,pcVar8);
}

Assistant:

static void detach_for_steal(__cilkrts_worker *w,
                             __cilkrts_worker *victim,
                             cilk_fiber* fiber)
{
    /* ASSERT: we own victim->lock */

    full_frame *parent_ff, *child_ff, *loot_ff;
    __cilkrts_stack_frame *volatile *h;
    __cilkrts_stack_frame *sf;

    w->l->team = victim->l->team;

    CILK_ASSERT(w->l->frame_ff == 0 || w == victim);

    h = victim->head;

    CILK_ASSERT(*h);

    victim->head = h + 1;

    parent_ff = victim->l->frame_ff;
    BEGIN_WITH_FRAME_LOCK(w, parent_ff) {
        /* parent no longer referenced by victim */
        decjoin(parent_ff);

        /* obtain the victim call stack */
        sf = *h;

        /* perform system-dependent normalizations */
        /*__cilkrts_normalize_call_stack_on_steal(sf);*/

        /* unroll PARENT_FF with call stack SF, adopt the youngest
           frame LOOT.  If loot_ff == parent_ff, then we hold loot_ff->lock,
           otherwise, loot_ff is newly created and we can modify it without
           holding its lock. */
        loot_ff = unroll_call_stack(w, parent_ff, sf);

        #if REDPAR_DEBUG >= 3
        fprintf(stderr, "[W=%d, victim=%d, desc=detach, parent_ff=%p, loot=%p]\n",
                w->self, victim->self,
                parent_ff, loot_ff);
        #endif

        if (WORKER_USER == victim->l->type &&
            NULL == victim->l->last_full_frame) {
            // Mark this looted frame as special: only the original user worker
            // may cross the sync.
            // 
            // This call is a shared access to
            // victim->l->last_full_frame.
            set_sync_master(victim, loot_ff);
        }

        /* LOOT is the next frame that the thief W is supposed to
           run, unless the thief is stealing from itself, in which
           case the thief W == VICTIM executes CHILD and nobody
           executes LOOT. */
        if (w == victim) {
            /* Pretend that frame has been stolen */
            loot_ff->call_stack->flags |= CILK_FRAME_UNSYNCHED;
            loot_ff->simulated_stolen = 1;
        }
        else
            __cilkrts_push_next_frame(w, loot_ff);

        // After this "push_next_frame" call, w now owns loot_ff.
        child_ff = make_child(w, loot_ff, 0, fiber);

        BEGIN_WITH_FRAME_LOCK(w, child_ff) {
            /* install child in the victim's work queue, taking
               the parent_ff's place */
            /* child is referenced by victim */
            incjoin(child_ff);

            // With this call, w is bestowing ownership of the newly
            // created frame child_ff to the victim, and victim is
            // giving up ownership of parent_ff.
            //
            // Worker w will either take ownership of parent_ff
            // if parent_ff == loot_ff, or parent_ff will be
            // suspended.
            //
            // Note that this call changes the victim->frame_ff
            // while the victim may be executing.
            make_runnable(victim, child_ff);
        } END_WITH_FRAME_LOCK(w, child_ff);
    } END_WITH_FRAME_LOCK(w, parent_ff);
}